

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

bool __thiscall Hospital::validate_String_Must_Be_Number(Hospital *this,string *id)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  bool bVar4;
  ulong uVar5;
  
  uVar2 = id->_M_string_length;
  if (uVar2 == 0) {
LAB_0011ca55:
    bVar4 = true;
  }
  else {
    pcVar3 = (id->_M_dataplus)._M_p;
    if ((byte)(*pcVar3 - 0x30U) < 10) {
      uVar5 = 1;
      bVar4 = false;
      do {
        if (*pcVar3 == '0') {
          return bVar4;
        }
        if (uVar2 == uVar5) goto LAB_0011ca55;
        bVar4 = uVar2 <= uVar5;
        pcVar1 = pcVar3 + uVar5;
        uVar5 = uVar5 + 1;
      } while ((byte)(*pcVar1 - 0x30U) < 10);
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool Hospital:: validate_String_Must_Be_Number(string id){
    int countr = 0;
    for (int i = 0; i <id.length() ; ++i) {
        if(id[i]>=48 && id[i]<=57 && id[0]!='0')countr ++;
        else {
            return false;
        }
    }
    if(countr == id.length())return true ;
}